

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O2

double __thiscall
AgentQLearner::getMaxState
          (AgentQLearner *this,Index sI,list<unsigned_int,_std::allocator<unsigned_int>_> *actions)

{
  double dVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint local_34;
  double local_30;
  
  if (actions != (list<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(actions);
  }
  auVar4 = ZEXT1664(ZEXT816(0xffefffffffffffff));
  local_34 = 0;
  do {
    uVar2 = *(ulong *)&(this->super_AgentFullyObservable).field_0x18;
    local_30 = auVar4._0_8_;
    if (uVar2 <= local_34) {
      return local_30;
    }
    dVar1 = *(double *)(uVar2 * sI * 8 + *(long *)&this->field_0x30 + (ulong)local_34 * 8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar1;
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar1 - local_30;
    auVar3 = vandpd_avx512vl(auVar5,auVar3);
    if (1e-09 <= auVar3._0_8_) {
      auVar3 = vmaxsd_avx(auVar6,auVar4._0_16_);
      if (actions == (list<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        auVar4 = ZEXT1664(auVar3);
      }
      else {
        auVar4 = ZEXT1664(auVar3);
        if (local_30 < dVar1) {
          local_30 = dVar1;
          std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::clear(actions);
          goto LAB_00410ecf;
        }
      }
    }
    else if (actions != (list<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
LAB_00410ecf:
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(actions,&local_34);
      auVar4 = ZEXT864((ulong)local_30);
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

double AgentQLearner::getMaxState(Index sI, list<Index>* actions) const
{
    if(actions)
        actions->clear();

    double dMax = -DBL_MAX;

    row_t row = _m_Q.GetRow(sI); // Q values for a specific state

    for(unsigned j = 0; j < row.size(); ++j)
    {
        if( std::abs( row(j) - dMax ) < EPSILON )
        {
            if(actions)
                actions->push_back(j);
        }
        else if( row(j) > dMax )
        {
            dMax = row(j);
            if(actions)
            {
                actions->clear();
                actions->push_back(j);
            }
        }
    }

    return dMax;
}